

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock.h
# Opt level: O2

bool __thiscall
testing::internal::OnCallSpec<BasicTestExpr<2>_(bool)>::Matches
          (OnCallSpec<BasicTestExpr<2>_(bool)> *this,ArgumentTuple *args)

{
  bool bVar1;
  
  bVar1 = TuplePrefix<1ul>::Matches<std::tuple<testing::Matcher<bool>>,std::tuple<bool>>
                    ((tuple<testing::Matcher<bool>_> *)(this + 0x10),args);
  if (bVar1) {
    bVar1 = MatcherBase<const_std::tuple<bool>_&>::Matches
                      ((MatcherBase<const_std::tuple<bool>_&> *)(this + 0x28),args);
    return bVar1;
  }
  return false;
}

Assistant:

bool Matches(const ArgumentTuple& args) const {
    return TupleMatches(matchers_, args) && extra_matcher_.Matches(args);
  }